

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O2

error __thiscall ald::imm_attr(ald *this,context *ctx,token *token,opcode *op)

{
  int iVar1;
  error *tmpres___LINE__;
  token local_50;
  
  iVar1 = equal(token,"a");
  if (iVar1 == 0) {
    fail((token *)this,(char *)token,"expected \'a\'");
  }
  else {
    context::tokenize(&local_50,ctx);
    token->column = local_50.column;
    (token->data).string._M_str = local_50.data.string._M_str;
    token->type = local_50.type;
    token->line = local_50.line;
    token->filename = local_50.filename;
    (token->data).predicate = local_50.data.predicate;
    confirm_type((token *)this,(token_type)token);
    if (*(long *)this == 0) {
      std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                ((unique_ptr<char[],_std::default_delete<char[]>_> *)this);
      context::tokenize(&local_50,ctx);
      token->column = local_50.column;
      (token->data).string._M_str = local_50.data.string._M_str;
      token->type = local_50.type;
      token->line = local_50.line;
      token->filename = local_50.filename;
      (token->data).predicate = local_50.data.predicate;
      uinteger<10,20>((context *)this,(token *)ctx,(opcode *)token);
      if (*(long *)this == 0) {
        std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                  ((unique_ptr<char[],_std::default_delete<char[]>_> *)this);
        opcode::add_bits(op,0xff00);
        confirm_type((token *)this,(token_type)token);
        if (*(long *)this == 0) {
          std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                    ((unique_ptr<char[],_std::default_delete<char[]>_> *)this);
          context::tokenize(&local_50,ctx);
          token->column = local_50.column;
          (token->data).string._M_str = local_50.data.string._M_str;
          token->type = local_50.type;
          token->line = local_50.line;
          token->filename = local_50.filename;
          (token->data).predicate = local_50.data.predicate;
          *(undefined8 *)this = 0;
        }
      }
    }
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)this;
}

Assistant:

DEFINE_OPERAND(imm_attr)
    {
        if (!equal(token, "a")) {
            return fail(token, "expected 'a'");
        }
        token = ctx.tokenize();

        CHECK(confirm_type(token, token_type::bracket_left));
        token = ctx.tokenize();

        CHECK((uinteger<10, 20>(ctx, token, op)));
        op.add_bits(0xFFULL << 8);

        CHECK(confirm_type(token, token_type::bracket_right));
        token = ctx.tokenize();
        return {};
    }